

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

bool __thiscall FlowGraph::DoesExitLabelDominate(FlowGraph *this,BranchInstr *leaveInstr)

{
  IRKind IVar1;
  OpCode OVar2;
  LabelInstr *this_00;
  Region *region1;
  code *pcVar3;
  bool bVar4;
  Instr *pIVar5;
  undefined4 *puVar6;
  Type *ppLVar7;
  FlowGraph *this_01;
  Instr *pIVar8;
  
  this_00 = leaveInstr->m_branchTarget;
  pIVar5 = IR::Instr::GetNextRealInstr(&this_00->super_Instr);
  if ((pIVar5->m_kind != InstrKindBranch) &&
     (pIVar5 = IR::Instr::GetNextRealInstr(&this_00->super_Instr),
     pIVar5->m_opcode != ProfiledLoopEnd)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x55,
                       "(leaveTarget->GetNextRealInstr()->IsBranchInstr() || leaveTarget->GetNextRealInstr()->m_opcode == Js::OpCode::ProfiledLoopEnd)"
                       ,
                       "leaveTarget->GetNextRealInstr()->IsBranchInstr() || leaveTarget->GetNextRealInstr()->m_opcode == Js::OpCode::ProfiledLoopEnd"
                      );
    if (!bVar4) goto LAB_0040e5b6;
    *puVar6 = 0;
  }
  pIVar5 = IR::Instr::GetNextBranchOrLabel(&this_00->super_Instr);
  if (pIVar5->m_kind == InstrKindBranch) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar4) goto LAB_0040e5b6;
    *puVar6 = 0;
  }
  do {
    pIVar8 = pIVar5;
    OVar2 = pIVar8->m_opcode;
    if ((OVar2 != Leave) && (OVar2 != BrOnException)) {
      if (OVar2 == Br) goto LAB_0040e57e;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x5a,
                         "(leaveChain->m_opcode == Js::OpCode::Leave || leaveChain->m_opcode == Js::OpCode::BrOnException)"
                         ,
                         "leaveChain->m_opcode == Js::OpCode::Leave || leaveChain->m_opcode == Js::OpCode::BrOnException"
                        );
      if (!bVar4) goto LAB_0040e5b6;
      *puVar6 = 0;
    }
    pIVar5 = pIVar8->m_next;
    IVar1 = pIVar5->m_kind;
    if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar4) goto LAB_0040e5b6;
      *puVar6 = 0;
    }
    pIVar5 = pIVar5->m_next;
  } while (pIVar5->m_kind == InstrKindBranch);
  if (pIVar5->m_opcode != ProfiledLoopEnd) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x5f,"(nextLabel->m_next->m_opcode == Js::OpCode::ProfiledLoopEnd)",
                       "nextLabel->m_next->m_opcode == Js::OpCode::ProfiledLoopEnd");
    if (!bVar4) {
LAB_0040e5b6:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
LAB_0040e57e:
  region1 = (Region *)pIVar8[1].m_next[1].m_src2;
  this_01 = (FlowGraph *)this->finallyLabelStack;
  ppLVar7 = SListBase<IR::LabelInstr_*,_Memory::ArenaAllocator,_RealCount>::Head
                      ((SListBase<IR::LabelInstr_*,_Memory::ArenaAllocator,_RealCount> *)this_01);
  bVar4 = Dominates(this_01,region1,(*ppLVar7)->m_region);
  return bVar4;
}

Assistant:

bool FlowGraph::DoesExitLabelDominate(IR::BranchInstr *leaveInstr)
{
    IR::LabelInstr * leaveTarget = leaveInstr->GetTarget();
    Assert(leaveTarget->GetNextRealInstr()->IsBranchInstr() || leaveTarget->GetNextRealInstr()->m_opcode == Js::OpCode::ProfiledLoopEnd);
    IR::BranchInstr *leaveChain = leaveTarget->GetNextBranchOrLabel()->AsBranchInstr();

    while (leaveChain->m_opcode != Js::OpCode::Br)
    {
        Assert(leaveChain->m_opcode == Js::OpCode::Leave || leaveChain->m_opcode == Js::OpCode::BrOnException);
        IR::LabelInstr * nextLabel = leaveChain->m_next->AsLabelInstr();
        if (!nextLabel->m_next->IsBranchInstr())
        {
            // For jit loop bodies - we can encounter ProfiledLoopEnd before every early return
            Assert(nextLabel->m_next->m_opcode == Js::OpCode::ProfiledLoopEnd);
            break;
        }
        leaveChain = nextLabel->m_next->AsBranchInstr();
    }
    IR::LabelInstr * exitLabel = leaveChain->GetTarget();
    return Dominates(exitLabel->GetRegion(), finallyLabelStack->Top()->GetRegion());
}